

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void mstltest(void)

{
  int iVar1;
  FILE *__stream;
  double *x;
  double **seasonal;
  double *trend;
  double *remainder;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __nmemb;
  ulong uVar5;
  long lVar6;
  undefined1 local_9cc8 [8];
  double temp [5000];
  uint local_50 [2];
  int f [2];
  int iterate;
  int s_window;
  int local_34 [2];
  int Nseas;
  
  __stream = fopen("../data/taylor.txt","r");
  if (__stream != (FILE *)0x0) {
    feof(__stream);
    lVar6 = 0;
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar3 = uVar4;
      lVar6 = lVar6 + 0x100000000;
      __isoc99_fscanf(__stream,"%lf \n",local_9cc8 + uVar5);
      uVar4 = uVar3 + 1;
      iVar1 = feof(__stream);
      uVar5 = uVar5 + 8;
    } while (iVar1 == 0);
    printf("N %d \n",uVar4 & 0xffffffff);
    __nmemb = lVar6 >> 0x20;
    x = (double *)malloc(lVar6 >> 0x1d);
    if (-1 < (long)uVar3) {
      memcpy(x,local_9cc8,uVar5 & 0x7fffffff8);
    }
    local_34[0] = 2;
    local_50[0] = 0x30;
    local_50[1] = 0x150;
    f[0] = 2;
    f[1] = 0xd;
    seasonal = (double **)calloc(2,8);
    trend = (double *)calloc(__nmemb,8);
    remainder = (double *)calloc(__nmemb,8);
    pdVar2 = (double *)calloc(__nmemb,8);
    *seasonal = pdVar2;
    pdVar2 = (double *)calloc(__nmemb,8);
    seasonal[1] = pdVar2;
    iVar1 = (int)uVar4;
    mstl(x,iVar1,(int *)local_50,local_34,f + 1,(double *)0x0,f,seasonal,trend,remainder);
    if (0 < local_34[0]) {
      lVar6 = 0;
      do {
        printf("\n Seasonal%d :\n",(ulong)(uint)f[lVar6 + -2]);
        if (-1 < (long)uVar3) {
          uVar5 = 0;
          do {
            printf("%g ",seasonal[lVar6][uVar5]);
            uVar5 = uVar5 + 1;
          } while ((uVar4 & 0xffffffff) != uVar5);
        }
        puts("\n");
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_34[0]);
    }
    mdisplay(trend,1,iVar1);
    mdisplay(remainder,1,iVar1);
    printf("\n %g %g %g %g \n",*x,x[1],x[__nmemb - 2],x[__nmemb - 1]);
    free(seasonal);
    free(trend);
    free(remainder);
    free(x);
    fclose(__stream);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void mstltest() {
	FILE *ifp;
	double temp[5000];
	double *x;
    ifp = fopen("../data/taylor.txt", "r");
	int N;
	int i,j;

	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}

	N = i;

	printf("N %d \n",N);

	x = (double*) malloc(sizeof(double)*N);

	for(i = 0; i < N;++i) {
		x[i] = temp[i];
	}
	int Nseas = 2;
	int f[2] = {48,336};
	int iterate = 2;
	double **seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double**)calloc(Nseas,sizeof(double*));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	for(i = 0; i < Nseas;++i) {
		seasonal[i] = (double*)calloc(N,sizeof(double));
	}

	mstl(x, N,f,&Nseas,&s_window,NULL,&iterate,seasonal,trend,remainder);

	for(i = 0; i < Nseas;++i) {
		printf("\n Seasonal%d :\n",f[i]);
		for(j = 0; j < N;++j) {
			printf("%g ",seasonal[i][j]);
		}
		printf("\n\n");
	}

	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);

	printf("\n %g %g %g %g \n",x[0],x[1],x[N-2],x[N-1]);
	free(seasonal);
	free(trend);
	free(remainder);
	free(x);
	fclose(ifp);
}